

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O1

void __thiscall
ipx::ForrestTomlin::ForrestTomlin
          (ForrestTomlin *this,Control *control,Int dim,
          unique_ptr<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_> *lu)

{
  size_t sVar1;
  int iVar2;
  LuFactorization *pLVar3;
  LuFactorization *pLVar4;
  double *__s;
  
  (this->super_LuUpdate).updates_ = 0;
  (this->super_LuUpdate)._vptr_LuUpdate = (_func_int **)&PTR__ForrestTomlin_00449880;
  this->control_ = control;
  this->dim_ = dim;
  (this->lu_)._M_t.
  super___uniq_ptr_impl<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_>._M_t.
  super__Tuple_impl<0UL,_ipx::LuFactorization_*,_std::default_delete<ipx::LuFactorization>_>.
  super__Head_base<0UL,_ipx::LuFactorization_*,_false>._M_head_impl = (LuFactorization *)0x0;
  (this->rowperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->rowperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->rowperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->colperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->colperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->colperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->rowperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->rowperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->rowperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->colperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->colperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->colperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->dependent_cols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dependent_cols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dependent_cols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SparseMatrix::SparseMatrix(&this->L_);
  SparseMatrix::SparseMatrix(&this->U_);
  SparseMatrix::SparseMatrix(&this->R_);
  (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->have_btran_ = false;
  this->have_ftran_ = false;
  *(undefined4 *)&this->fill_factor_ = 0;
  *(undefined4 *)((long)&this->fill_factor_ + 4) = 0;
  *(undefined4 *)&this->pivottol_ = 0x9999999a;
  *(undefined4 *)((long)&this->pivottol_ + 4) = 0x3fb99999;
  (this->work_)._M_size = 0;
  (this->work_)._M_data = (double *)0x0;
  iVar2 = this->dim_;
  sVar1 = (long)iVar2 + 5000;
  if ((int)sVar1 != 0) {
    operator_delete((this->work_)._M_data);
    (this->work_)._M_size = sVar1;
    __s = (double *)operator_new(sVar1 * 8);
    (this->work_)._M_data = __s;
    memset(__s,0,(long)iVar2 * 8 + 40000);
  }
  pLVar3 = (lu->_M_t).
           super___uniq_ptr_impl<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_>.
           _M_t.
           super__Tuple_impl<0UL,_ipx::LuFactorization_*,_std::default_delete<ipx::LuFactorization>_>
           .super__Head_base<0UL,_ipx::LuFactorization_*,_false>._M_head_impl;
  (lu->_M_t).super___uniq_ptr_impl<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_>
  ._M_t.super__Tuple_impl<0UL,_ipx::LuFactorization_*,_std::default_delete<ipx::LuFactorization>_>.
  super__Head_base<0UL,_ipx::LuFactorization_*,_false>._M_head_impl = (LuFactorization *)0x0;
  pLVar4 = (this->lu_)._M_t.
           super___uniq_ptr_impl<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_>.
           _M_t.
           super__Tuple_impl<0UL,_ipx::LuFactorization_*,_std::default_delete<ipx::LuFactorization>_>
           .super__Head_base<0UL,_ipx::LuFactorization_*,_false>._M_head_impl;
  (this->lu_)._M_t.
  super___uniq_ptr_impl<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_>._M_t.
  super__Tuple_impl<0UL,_ipx::LuFactorization_*,_std::default_delete<ipx::LuFactorization>_>.
  super__Head_base<0UL,_ipx::LuFactorization_*,_false>._M_head_impl = pLVar3;
  if (pLVar4 != (LuFactorization *)0x0) {
    (*pLVar4->_vptr_LuFactorization[1])();
    return;
  }
  return;
}

Assistant:

ForrestTomlin::ForrestTomlin(const Control& control, Int dim,
                             std::unique_ptr<LuFactorization>& lu) :
    control_(control), dim_(dim) {
    work_.resize(dim_ + kMaxUpdates);
    lu_ = std::move(lu);
}